

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_strfmt.c
# Opt level: O2

char * lj_strfmt_pushvf(lua_State *L,char *fmt,__va_list_tag *argp)

{
  SBuf *sb;
  uint uVar1;
  undefined4 uVar2;
  TValue *pTVar3;
  SFormat sf;
  size_t sVar4;
  long *plVar5;
  lua_Number *plVar6;
  undefined4 *puVar7;
  undefined8 *puVar8;
  char *pcVar9;
  GCstr *pGVar10;
  uint *puVar11;
  int *piVar12;
  uint64_t k;
  ulong uVar13;
  FormatState fs;
  
  uVar13 = (ulong)(L->glref).ptr32;
  sb = (SBuf *)(uVar13 + 0xe8);
  *(int *)(uVar13 + 0xf4) = (int)L;
  *(undefined4 *)(uVar13 + 0xe8) = *(undefined4 *)(uVar13 + 0xf0);
  sVar4 = strlen(fmt);
  fs.e = (uint8_t *)(fmt + (sVar4 & 0xffffffff));
  fs.p = (uint8_t *)fmt;
LAB_00117dec:
  sf = lj_strfmt_parse(&fs);
  if (sf == 0) {
    pGVar10 = lj_str_new(L,(char *)(ulong)*(uint *)(uVar13 + 0xf0),
                         (ulong)(*(int *)(uVar13 + 0xe8) - *(uint *)(uVar13 + 0xf0)));
    pTVar3 = L->top;
    (pTVar3->u32).lo = (uint32_t)pGVar10;
    (pTVar3->field_2).it = 0xfffffffb;
    pTVar3 = L->top;
    L->top = pTVar3 + 1;
    if ((TValue *)(ulong)(L->maxstack).ptr32 <= pTVar3 + 1) {
      lj_state_growstack1(L);
    }
    return (char *)(pGVar10 + 1);
  }
  switch(sf & 0xf) {
  case 2:
    lj_buf_putmem(sb,fs.str,fs.len);
    goto LAB_00117dec;
  case 3:
    uVar1 = argp->gp_offset;
    if ((ulong)uVar1 < 0x29) {
      piVar12 = (int *)((ulong)uVar1 + (long)argp->reg_save_area);
      argp->gp_offset = uVar1 + 8;
    }
    else {
      piVar12 = (int *)argp->overflow_arg_area;
      argp->overflow_arg_area = piVar12 + 2;
    }
    k = (uint64_t)*piVar12;
    break;
  case 4:
    uVar1 = argp->gp_offset;
    if ((ulong)uVar1 < 0x29) {
      puVar11 = (uint *)((ulong)uVar1 + (long)argp->reg_save_area);
      argp->gp_offset = uVar1 + 8;
    }
    else {
      puVar11 = (uint *)argp->overflow_arg_area;
      argp->overflow_arg_area = puVar11 + 2;
    }
    k = (uint64_t)*puVar11;
    break;
  case 5:
    uVar1 = argp->fp_offset;
    if ((ulong)uVar1 < 0xa1) {
      plVar6 = (lua_Number *)((ulong)uVar1 + (long)argp->reg_save_area);
      argp->fp_offset = uVar1 + 0x10;
    }
    else {
      plVar6 = (lua_Number *)argp->overflow_arg_area;
      argp->overflow_arg_area = plVar6 + 1;
    }
    lj_strfmt_putfnum(sb,0xf000035,*plVar6);
    goto LAB_00117dec;
  case 6:
    uVar1 = argp->gp_offset;
    if ((ulong)uVar1 < 0x29) {
      plVar5 = (long *)((ulong)uVar1 + (long)argp->reg_save_area);
      argp->gp_offset = uVar1 + 8;
    }
    else {
      plVar5 = (long *)argp->overflow_arg_area;
      argp->overflow_arg_area = plVar5 + 1;
    }
    pcVar9 = (char *)*plVar5;
    if (pcVar9 == (char *)0x0) {
      pcVar9 = "(null)";
    }
    sVar4 = strlen(pcVar9);
    lj_buf_putmem(sb,pcVar9,(MSize)sVar4);
    goto LAB_00117dec;
  case 7:
    uVar1 = argp->gp_offset;
    if ((ulong)uVar1 < 0x29) {
      puVar7 = (undefined4 *)((ulong)uVar1 + (long)argp->reg_save_area);
      argp->gp_offset = uVar1 + 8;
    }
    else {
      puVar7 = (undefined4 *)argp->overflow_arg_area;
      argp->overflow_arg_area = puVar7 + 2;
    }
    uVar2 = *puVar7;
    pcVar9 = (char *)(ulong)*(uint *)(uVar13 + 0xe8);
    if (*(uint *)(uVar13 + 0xec) == *(uint *)(uVar13 + 0xe8)) {
      pcVar9 = lj_buf_more2(sb,1);
    }
    *pcVar9 = (char)uVar2;
    (sb->p).ptr32 = (int)pcVar9 + 1;
    goto LAB_00117dec;
  case 8:
    uVar1 = argp->gp_offset;
    if ((ulong)uVar1 < 0x29) {
      puVar8 = (undefined8 *)((ulong)uVar1 + (long)argp->reg_save_area);
      argp->gp_offset = uVar1 + 8;
    }
    else {
      puVar8 = (undefined8 *)argp->overflow_arg_area;
      argp->overflow_arg_area = puVar8 + 1;
    }
    lj_strfmt_putptr(sb,(void *)*puVar8);
    goto LAB_00117dec;
  default:
    goto switchD_00117e10_default;
  }
  lj_strfmt_putfxint(sb,sf,k);
  goto LAB_00117dec;
switchD_00117e10_default:
  pcVar9 = (char *)(ulong)*(uint *)(uVar13 + 0xe8);
  if (*(uint *)(uVar13 + 0xec) == *(uint *)(uVar13 + 0xe8)) {
    pcVar9 = lj_buf_more2(sb,1);
  }
  *pcVar9 = '?';
  (sb->p).ptr32 = (int)pcVar9 + 1;
  goto LAB_00117dec;
}

Assistant:

const char *lj_strfmt_pushvf(lua_State *L, const char *fmt, va_list argp)
{
  SBuf *sb = lj_buf_tmp_(L);
  FormatState fs;
  SFormat sf;
  GCstr *str;
  lj_strfmt_init(&fs, fmt, (MSize)strlen(fmt));
  while ((sf = lj_strfmt_parse(&fs)) != STRFMT_EOF) {
    switch (STRFMT_TYPE(sf)) {
    case STRFMT_LIT:
      lj_buf_putmem(sb, fs.str, fs.len);
      break;
    case STRFMT_INT:
      lj_strfmt_putfxint(sb, sf, va_arg(argp, int32_t));
      break;
    case STRFMT_UINT:
      lj_strfmt_putfxint(sb, sf, va_arg(argp, uint32_t));
      break;
    case STRFMT_NUM:
      lj_strfmt_putfnum(sb, STRFMT_G14, va_arg(argp, lua_Number));
      break;
    case STRFMT_STR: {
      const char *s = va_arg(argp, char *);
      if (s == NULL) s = "(null)";
      lj_buf_putmem(sb, s, (MSize)strlen(s));
      break;
      }
    case STRFMT_CHAR:
      lj_buf_putb(sb, va_arg(argp, int));
      break;
    case STRFMT_PTR:
      lj_strfmt_putptr(sb, va_arg(argp, void *));
      break;
    case STRFMT_ERR:
    default:
      lj_buf_putb(sb, '?');
      lj_assertL(0, "bad string format near offset %d", fs.len);
      break;
    }
  }
  str = lj_buf_str(L, sb);
  setstrV(L, L->top, str);
  incr_top(L);
  return strdata(str);
}